

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

error<idx2::err_code> idx2::WriteVolume(cstr FileName,volume *Vol,extent *Ext)

{
  u64 uVar1;
  u64 uVar2;
  FILE *__s;
  long lVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  long *in_FS_OFFSET;
  bool bVar16;
  error<idx2::err_code> eVar17;
  int local_48;
  int local_40;
  
  __s = fopen(FileName,"wb");
  switch(Vol->Type) {
  case int8:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar3 = (long)(uVar1 * 2) >> 0x2b;
    lVar8 = Vol->Dims << 0x2b;
    lVar5 = lVar8 >> 0x2b;
    lVar7 = Vol->Dims << 0x16;
    lVar13 = (lVar7 >> 0x2b) * lVar5;
    lVar9 = (((long)(uVar2 * 2) >> 0x2b) + lVar3) * lVar13;
    lVar13 = lVar13 * lVar3;
    bVar16 = lVar13 - lVar9 == 0;
    if (bVar16) break;
    lVar3 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar5;
    pbVar14 = (Vol->Buffer).Data;
    pbVar15 = pbVar14 + lVar3 + lVar13 + lVar11;
    sVar4 = fwrite(pbVar15,1,1,__s);
    if (sVar4 == 1) {
      local_40 = (int)(lVar8 >> 0x2b);
      iVar12 = 0;
      iVar10 = 0;
      do {
        iVar10 = iVar10 + 1;
        pbVar15 = pbVar15 + 1;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar10) {
          iVar12 = iVar12 + 1;
          pbVar15 = pbVar15 + (lVar5 - ((long)(uVar2 << 0x2b) >> 0x2b));
          iVar10 = 0;
          local_48 = (int)((long)(uVar2 << 0x16) >> 0x2b);
          if (local_48 <= iVar12) {
            pbVar15 = pbVar15 + ((long)((int)(lVar7 >> 0x2b) * local_40) -
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar8 >> 0xb)) >> 0x20));
            iVar12 = 0;
            iVar10 = 0;
          }
        }
        bVar16 = pbVar15 == pbVar14 + lVar9 + lVar3 + lVar11;
        if (bVar16) goto LAB_0019eca8;
        sVar4 = fwrite(pbVar15,1,1,__s);
      } while (sVar4 == 1);
    }
LAB_0019ec71:
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x70;
    uVar6 = 0xc;
    goto LAB_0019ecaa;
  case uint8:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar3 = (long)(uVar1 * 2) >> 0x2b;
    lVar8 = Vol->Dims << 0x2b;
    lVar5 = lVar8 >> 0x2b;
    lVar7 = Vol->Dims << 0x16;
    lVar13 = (lVar7 >> 0x2b) * lVar5;
    lVar9 = (((long)(uVar2 * 2) >> 0x2b) + lVar3) * lVar13;
    lVar13 = lVar13 * lVar3;
    bVar16 = lVar13 - lVar9 == 0;
    if (!bVar16) {
      lVar3 = (long)(uVar1 << 0x2b) >> 0x2b;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar5;
      pbVar14 = (Vol->Buffer).Data;
      pbVar15 = pbVar14 + lVar3 + lVar13 + lVar11;
      sVar4 = fwrite(pbVar15,1,1,__s);
      if (sVar4 == 1) {
        local_40 = (int)(lVar8 >> 0x2b);
        iVar12 = 0;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + 1;
          pbVar15 = pbVar15 + 1;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar10) {
            iVar12 = iVar12 + 1;
            pbVar15 = pbVar15 + (lVar5 - ((long)(uVar2 << 0x2b) >> 0x2b));
            iVar10 = 0;
            local_48 = (int)((long)(uVar2 << 0x16) >> 0x2b);
            if (local_48 <= iVar12) {
              pbVar15 = pbVar15 + ((long)((int)(lVar7 >> 0x2b) * local_40) -
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar8 >> 0xb)) >> 0x20));
              iVar12 = 0;
              iVar10 = 0;
            }
          }
          bVar16 = pbVar15 == pbVar14 + lVar9 + lVar3 + lVar11;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar15,1,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case int16:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 2 == lVar13 * 2;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 2 + lVar11 * 2 + lVar3 * 2;
      sVar4 = fwrite(pbVar14,2,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 2;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 2 + ((long)(uVar2 << 0x2b) >> 0x2b) * -2;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 2 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -2;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 2 + lVar11 * 2 + lVar13 * 2;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,2,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case uint16:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 2 == lVar13 * 2;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 2 + lVar11 * 2 + lVar3 * 2;
      sVar4 = fwrite(pbVar14,2,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 2;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 2 + ((long)(uVar2 << 0x2b) >> 0x2b) * -2;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 2 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -2;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 2 + lVar11 * 2 + lVar13 * 2;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,2,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case int32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 4 + lVar13 * -4 == 0;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 4 + lVar11 * 4 + lVar3 * 4;
      sVar4 = fwrite(pbVar14,4,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 4;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 4 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -4;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 4 + lVar11 * 4 + lVar13 * 4;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,4,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case uint32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 4 + lVar13 * -4 == 0;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 4 + lVar11 * 4 + lVar3 * 4;
      sVar4 = fwrite(pbVar14,4,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 4;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 4 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -4;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 4 + lVar11 * 4 + lVar13 * 4;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,4,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case int64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 8 + lVar13 * -8 == 0;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 8 + lVar11 * 8 + lVar3 * 8;
      sVar4 = fwrite(pbVar14,8,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 8;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 8 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -8;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 8 + lVar11 * 8 + lVar13 * 8;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,8,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case uint64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 8 + lVar13 * -8 == 0;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 8 + lVar11 * 8 + lVar3 * 8;
      sVar4 = fwrite(pbVar14,8,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 8;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 8 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -8;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 8 + lVar11 * 8 + lVar13 * 8;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,8,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case float32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 4 + lVar13 * -4 == 0;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 4 + lVar11 * 4 + lVar3 * 4;
      sVar4 = fwrite(pbVar14,4,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 4;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 4 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -4;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 4 + lVar11 * 4 + lVar13 * 4;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,4,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  case float64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar5 = (long)(uVar1 * 2) >> 0x2b;
    lVar9 = Vol->Dims << 0x2b;
    lVar7 = lVar9 >> 0x2b;
    lVar8 = Vol->Dims << 0x16;
    lVar3 = (lVar8 >> 0x2b) * lVar7;
    lVar13 = (((long)(uVar2 * 2) >> 0x2b) + lVar5) * lVar3;
    lVar3 = lVar3 * lVar5;
    bVar16 = lVar3 * 8 + lVar13 * -8 == 0;
    if (!bVar16) {
      lVar5 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar15 = (Vol->Buffer).Data;
      lVar11 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar7;
      pbVar14 = pbVar15 + lVar5 * 8 + lVar11 * 8 + lVar3 * 8;
      sVar4 = fwrite(pbVar14,8,1,__s);
      if (sVar4 == 1) {
        local_48 = (int)(lVar9 >> 0x2b);
        iVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + 1;
          pbVar14 = pbVar14 + 8;
          if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar12) {
            iVar10 = iVar10 + 1;
            pbVar14 = pbVar14 + lVar7 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
            iVar12 = 0;
            if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar10) {
              pbVar14 = pbVar14 + (long)((int)(lVar8 >> 0x2b) * local_48) * 8 +
                                  ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                         (lVar9 >> 0xb)) >> 0x20) * -8;
              iVar10 = 0;
              iVar12 = 0;
            }
          }
          bVar16 = pbVar14 == pbVar15 + lVar5 * 8 + lVar11 * 8 + lVar13 * 8;
          if (bVar16) goto LAB_0019eca8;
          sVar4 = fwrite(pbVar14,8,1,__s);
        } while (sVar4 == 1);
      }
      goto LAB_0019ec71;
    }
    break;
  default:
    goto switchD_0019dca0_default;
  }
LAB_0019eca8:
  uVar6 = 0;
LAB_0019ecaa:
  if (bVar16) {
switchD_0019dca0_default:
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x70;
    uVar6 = 0;
  }
  fclose(__s);
  eVar17.Code = (int)uVar6;
  eVar17.StackIdx = (char)((ulong)uVar6 >> 0x20);
  eVar17.StrGened = (bool)(char)((ulong)uVar6 >> 0x28);
  eVar17._14_2_ = (short)((ulong)uVar6 >> 0x30);
  eVar17.Msg = "";
  return eVar17;
}

Assistant:

error<>
WriteVolume(cstr FileName, const volume& Vol, const extent& Ext)
{
  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(fclose(Fp));
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Ext, Vol);                                                                \
  for (auto It = Begin<type>(Ext, Vol); It != EndIt; ++It)                                         \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}